

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_dense.cpp
# Opt level: O1

int main(void)

{
  Scalar SVar1;
  int iVar2;
  time_t tVar3;
  void *pvVar4;
  ostream *poVar5;
  undefined8 *puVar6;
  char *__function;
  Index i;
  long lVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  RowVector xopt;
  RowVector residual;
  Matrix<double,__1,__1,_0,__1,__1> A;
  RowVector x;
  RowVector b;
  scalar_sum_op<double,_double> local_c9;
  void *local_c8;
  void **ppvStack_c0;
  Solver *local_b8;
  long local_b0;
  DenseStorage<double,__1,__1,__1,_0> local_a8;
  CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
  local_88;
  void *local_78;
  void **local_70;
  void *local_68 [2];
  undefined1 local_54 [4];
  undefined1 local_50 [32];
  void **local_30;
  undefined8 local_20;
  
  tVar3 = time((time_t *)0x0);
  srand((uint)tVar3);
  local_a8.m_data = (double *)0x0;
  local_a8.m_rows = 0;
  local_a8.m_cols = 0;
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_a8,1000,100,10);
  local_c8 = (void *)0x0;
  ppvStack_c0 = (void **)0x0;
  free((void *)0x0);
  pvVar4 = malloc(0x50);
  if (((ulong)pvVar4 & 0xf) != 0) {
    __assert_fail("(size<16 || (std::size_t(result)%16)==0) && \"System\'s malloc returned an unaligned pointer. Compile with EIGEN_MALLOC_ALREADY_ALIGNED=0 to fallback to handmade aligned memory allocator.\""
                  ,"/usr/include/eigen3/Eigen/src/Core/util/Memory.h",0xb9,
                  "void *Eigen::internal::aligned_malloc(std::size_t)");
  }
  if (pvVar4 == (void *)0x0) {
    puVar6 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar6 = srand;
    __cxa_throw(puVar6,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  ppvStack_c0 = (void **)0xa;
  lVar7 = 0;
  local_c8 = pvVar4;
  do {
    iVar2 = rand();
    *(double *)((long)pvVar4 + lVar7 * 8) = ((double)iVar2 + (double)iVar2) / 2147483647.0 + -1.0;
    lVar7 = lVar7 + 1;
  } while (lVar7 != 10);
  local_50._0_8_ = local_a8.m_rows;
  local_50._8_8_ = local_a8.m_cols;
  if ((local_a8.m_cols | local_a8.m_rows) < 0) {
    __function = 
    "Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>, Eigen::Matrix<double, -1, -1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_random_op<double>, MatrixType = Eigen::Matrix<double, -1, -1>]"
    ;
LAB_001035ff:
    __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                  ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,__function);
  }
  Eigen::internal::
  call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>,Eigen::internal::assign_op<double,double>>
            ((Matrix<double,__1,__1,_0,__1,__1> *)&local_a8,
             (CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
              *)local_50,(assign_op<double,_double> *)&local_88);
  if ((void **)local_a8.m_cols != ppvStack_c0) {
    __assert_fail("lhs.cols() == rhs.rows() && \"invalid matrix product\" && \"if you wanted a coeff-wise or a dot product use the respective explicit functions\""
                  ,"/usr/include/eigen3/Eigen/src/Core/Product.h",0x62,
                  "Eigen::Product<Eigen::Matrix<double, -1, -1>, Eigen::Matrix<double, -1, 1>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Matrix<double, -1, -1>, Rhs = Eigen::Matrix<double, -1, 1>, Option = 0]"
                 );
  }
  local_50._0_8_ = &local_a8;
  local_50._8_8_ = &local_c8;
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
  PlainObjectBase<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,0>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)local_68,
             (DenseBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>
              *)local_50);
  local_54 = (undefined1  [4])0x3e8;
  rek::Solver::solve((Solver *)&local_78,(Matrix<double,__1,__1,_0,__1,__1> *)local_54,
                     (RowVector *)&local_a8,(long)local_68);
  if (local_70 != ppvStack_c0) {
    __assert_fail("aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols()",
                  "/usr/include/eigen3/Eigen/src/Core/CwiseBinaryOp.h",0x74,
                  "Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_difference_op<double>, Lhs = const Eigen::Matrix<double, -1, 1>, Rhs = const Eigen::Matrix<double, -1, 1>]"
                 );
  }
  if ((long)ppvStack_c0 < 0) {
    __function = 
    "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = const Eigen::Matrix<double, -1, 1>]"
    ;
    goto LAB_001035ff;
  }
  local_30 = ppvStack_c0;
  local_20 = 0x40094c583ada5b53;
  local_50._8_8_ = (Solver *)&local_78;
  local_50._16_8_ = &local_c8;
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_b8,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
              *)local_50);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Error is ",9);
  local_88.m_xpr = (XprTypeNested)&local_b8;
  if (local_b0 == 0) {
    uVar8 = 0;
    uVar9 = 0;
  }
  else {
    if (local_b0 < 1) goto LAB_00103576;
    local_50._8_8_ = local_b8;
    SVar1 = Eigen::internal::
            redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Matrix<double,-1,1,0,-1,1>const>>,3,0>
            ::
            run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                      ((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                        *)local_50,&local_c9,&local_88);
    uVar8 = SUB84(SVar1,0);
    uVar9 = (undefined4)((ulong)SVar1 >> 0x20);
  }
  poVar5 = std::ostream::_M_insert<double>(SQRT((double)CONCAT44(uVar9,uVar8)));
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  if (local_b0 == 0) {
    uVar8 = 0;
    uVar9 = 0;
    local_88.m_xpr = (XprTypeNested)&local_b8;
  }
  else {
    if (local_b0 < 1) {
LAB_00103576:
      local_88.m_xpr = (XprTypeNested)&local_b8;
      __assert_fail("this->rows()>0 && this->cols()>0 && \"you are using an empty matrix\"",
                    "/usr/include/eigen3/Eigen/src/Core/Redux.h",0x19b,
                    "typename internal::traits<Derived>::Scalar Eigen::DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>, const Eigen::Matrix<double, -1, 1>>>::redux(const Func &) const [Derived = Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>, const Eigen::Matrix<double, -1, 1>>, BinaryOp = Eigen::internal::scalar_sum_op<double>]"
                   );
    }
    local_50._8_8_ = local_b8;
    local_88.m_xpr = (XprTypeNested)&local_b8;
    SVar1 = Eigen::internal::
            redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Matrix<double,-1,1,0,-1,1>const>>,3,0>
            ::
            run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                      ((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                        *)local_50,&local_c9,&local_88);
    uVar8 = SUB84(SVar1,0);
    uVar9 = (undefined4)((ulong)SVar1 >> 0x20);
  }
  if (0.01 < SQRT((double)CONCAT44(uVar9,uVar8))) {
    __assert_fail("residual.norm() <= 0.01",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/zouzias[P]REK-CPP/test/test_dense.cpp"
                  ,0x18,"int main()");
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Success...",10);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x80);
  std::ostream::put(-0x80);
  std::ostream::flush();
  free(local_b8);
  free(local_78);
  free(local_68[0]);
  free(local_c8);
  free(local_a8.m_data);
  return 0;
}

Assistant:

int main() {
  srand((unsigned int)time(nullptr));
  unsigned int m = 100, n = 10;
  long ITERS = 10000;

  Matrix<double, Dynamic, Dynamic> A(m, n);
  rek::RowVector xopt(n);
  xopt.setRandom();
  A.setRandom();
  rek::RowVector b = A * xopt;

  auto solver = Solver();
  rek::RowVector x = solver.solve(A, b, ITERS);

  // Error should be small
  rek::RowVector residual = (x - xopt) / std::sqrt(n);
  std::cout << "Error is " << residual.norm() << std::endl;
  assert(residual.norm() <= 0.01);
  std::cout << "Success..." << std::endl;

  return 0;
}